

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  STACK *this;
  ostream *poVar5;
  size_type sVar6;
  STACK *this_00;
  ulong uVar7;
  bool bVar8;
  int e;
  queue<int,_std::deque<int,_std::allocator<int>_>_> arg_list;
  cmd_paresr lab01_parser;
  
  cmd_paresr::cmd_paresr(&lab01_parser,argc,argv);
  this = (STACK *)0x0;
  do {
    iVar3 = cmd_paresr::now_pos(&lab01_parser);
    iVar4 = cmd_paresr::ops_num(&lab01_parser);
    if (iVar4 <= iVar3) {
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      cmd_paresr::~cmd_paresr(&lab01_parser);
      return 0;
    }
    std::queue<int,std::deque<int,std::allocator<int>>>::
    queue<std::deque<int,std::allocator<int>>,void>(&arg_list);
    cVar2 = cmd_paresr::next_step(&lab01_parser,&arg_list);
    this_00 = this;
    switch(cVar2) {
    case 'A':
      std::operator<<((ostream *)&std::cout," A");
      iVar3 = *arg_list.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
      this_00 = (STACK *)operator_new(0x18);
      STACK::STACK(this_00,iVar3);
      (*this_00->_vptr_STACK[5])(this_00,this);
      std::deque<int,_std::allocator<int>_>::pop_front
                ((deque<int,_std::allocator<int>_> *)&arg_list);
      std::operator<<((ostream *)&std::cout," ");
      (*this_00->_vptr_STACK[6])(this_00);
      break;
    case 'B':
    case 'D':
    case 'E':
    case 'F':
    case 'H':
    case 'J':
    case 'K':
    case 'L':
    case 'M':
      break;
    case 'C':
      std::operator<<((ostream *)&std::cout," C");
      this_00 = (STACK *)operator_new(0x18);
      STACK::STACK(this_00,this);
      std::operator<<((ostream *)&std::cout," ");
      (*this_00->_vptr_STACK[6])(this_00);
      break;
    case 'G':
      std::operator<<((ostream *)&std::cout," G");
      uVar1 = *arg_list.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
      iVar3 = (*this->_vptr_STACK[1])(this);
      if (iVar3 <= (int)uVar1) {
        poVar5 = std::operator<<((ostream *)&std::cout," E");
        std::endl<char,std::char_traits<char>>(poVar5);
LAB_00102722:
        exit(0);
      }
      poVar5 = std::operator<<((ostream *)&std::cout," ");
      iVar3 = (*this->_vptr_STACK[2])(this,(ulong)uVar1);
      std::ostream::operator<<(poVar5,iVar3);
LAB_001024ee:
      std::deque<int,_std::allocator<int>_>::pop_front
                ((deque<int,_std::allocator<int>_> *)&arg_list);
      this_00 = this;
      break;
    case 'I':
      std::operator<<((ostream *)&std::cout," I");
      sVar6 = std::deque<int,_std::allocator<int>_>::size
                        ((deque<int,_std::allocator<int>_> *)&arg_list);
      iVar3 = (**this->_vptr_STACK)(this);
      iVar4 = (*this->_vptr_STACK[1])(this);
      if (iVar3 - iVar4 < (int)sVar6) {
        poVar5 = std::operator<<((ostream *)&std::cout," E");
        std::endl<char,std::char_traits<char>>(poVar5);
        goto LAB_00102722;
      }
      uVar7 = sVar6 & 0xffffffff;
      if ((int)sVar6 < 1) {
        uVar7 = 0;
      }
      while (iVar3 = (int)uVar7, uVar7 = (ulong)(iVar3 - 1), iVar3 != 0) {
        (*this->_vptr_STACK[3])
                  (this,(ulong)(uint)*arg_list.c.super__Deque_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Deque_impl_data._M_start._M_cur);
        std::deque<int,_std::allocator<int>_>::pop_front
                  ((deque<int,_std::allocator<int>_> *)&arg_list);
      }
      std::operator<<((ostream *)&std::cout," ");
      (*this->_vptr_STACK[6])(this);
      break;
    case 'N':
      std::operator<<((ostream *)&std::cout," N");
      poVar5 = std::operator<<((ostream *)&std::cout," ");
      iVar3 = (*this->_vptr_STACK[1])(this);
      std::ostream::operator<<(poVar5,iVar3);
      break;
    case 'O':
      std::operator<<((ostream *)&std::cout," O");
      iVar3 = *arg_list.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
      iVar4 = (*this->_vptr_STACK[1])(this);
      if (iVar4 < iVar3) {
        poVar5 = std::operator<<((ostream *)&std::cout," E");
        std::endl<char,std::char_traits<char>>(poVar5);
        goto LAB_00102722;
      }
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      while (bVar8 = iVar3 != 0, iVar3 = iVar3 + -1, bVar8) {
        (*this->_vptr_STACK[4])(this,&e);
      }
      std::deque<int,_std::allocator<int>_>::pop_front
                ((deque<int,_std::allocator<int>_> *)&arg_list);
      iVar3 = (*this->_vptr_STACK[1])(this);
      if (iVar3 != 0) {
        std::operator<<((ostream *)&std::cout," ");
        (*this->_vptr_STACK[6])(this);
      }
      break;
    default:
      if (cVar2 == 'S') {
        std::operator<<((ostream *)&std::cout,"S");
        iVar3 = *arg_list.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                 super__Deque_impl_data._M_start._M_cur;
        this = (STACK *)operator_new(0x18);
        STACK::STACK(this,iVar3);
        poVar5 = std::operator<<((ostream *)&std::cout," ");
        std::ostream::operator<<(poVar5,iVar3);
        goto LAB_001024ee;
      }
    }
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
              ((_Deque_base<int,_std::allocator<int>_> *)&arg_list);
    this = this_00;
  } while( true );
}

Assistant:

int main(int argc, char **argv) {
  char op;
  int arg;
  STACK *mystack = nullptr;
  // Set output file
  cmd_paresr lab01_parser = cmd_paresr(argc, argv);
  while (lab01_parser.now_pos() < lab01_parser.ops_num()) {
    queue<int> arg_list;
    op = lab01_parser.next_step(arg_list);
    switch (op) {
      case 'S': {
        cout << "S";
        arg = arg_list.front();
        mystack = new STACK(arg);
        cout << " " << arg;
        arg_list.pop();
        break;
      }
      case 'I': {
        cout << " I";
        int size = arg_list.size();
        // Test if the stack can overflow
        if (mystack->size() - int(*mystack) < size) {
          cout << " E" << endl;
          exit(0);
        }
        for (int i = 0; i < size; i++) {
          arg = arg_list.front();
          *mystack << arg;
          arg_list.pop();
        }
        cout << " ";
        mystack->print();
        break;
      }
      case 'O': {
        cout << " O";
        int e;
        arg = arg_list.front();
        // Test if the stack can be empty
        if (int(*mystack) < arg) {
          cout << " E" << endl;
          exit(0);
        }
        for (int i = 0; i < arg; i++)
          *mystack >> e;
        arg_list.pop();
        if (int(*mystack) != 0) {
          cout << " ";
          mystack->print();
        }
        break;
      }
      case 'A': {
        cout << " A";
        arg = arg_list.front();
        STACK *new_stack = new STACK(arg);
        *new_stack = *mystack;
        mystack = new_stack;
        arg_list.pop();
        cout << " ";
        mystack->print();
        break;
      }
      case 'C': {
        cout << " C";
        STACK *new_stack = new STACK(*mystack);
        mystack = new_stack;
        cout << " ";
        mystack->print();  
        break;
      }
      case 'N': {
        cout << " N";
        cout << " " << int(*mystack);
        break;
      }
      case 'G': {
        cout << " G";
        arg = arg_list.front();
        if (arg >= int(*mystack)) {
          cout << " E" << endl;
          exit(0);
        }
        cout << " " << (*mystack)[arg];
        arg_list.pop();
        break;
      }
    }
  }
  cout << endl;
  return 0;
}